

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O0

bool __thiscall
binlog::SessionWriter::
addEvent<std::multiset<int,std::less<int>,std::allocator<int>>&,std::multimap<int,char,std::less<int>,std::allocator<std::pair<int_const,char>>>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          multiset<int,_std::less<int>,_std::allocator<int>_> *args,
          multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_> *args_1)

{
  undefined1 uVar1;
  bool bVar2;
  Queue *pQVar3;
  size_t in_stack_00000010;
  SessionWriter *in_stack_00000018;
  size_t totalSize;
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [4];
  size_t sizes [4];
  size_t size;
  QueueWriter *in_stack_ffffffffffffff18;
  QueueWriter *ostream;
  unsigned_long *in_stack_ffffffffffffff20;
  multiset<int,_std::less<int>,_std::allocator<int>_> *in;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  QueueWriter *this_00;
  undefined1 local_88 [8];
  char *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  undefined1 local_58 [32];
  char *local_38 [7];
  
  local_38[0] = (char *)0x0;
  local_58._0_8_ = (char *)0x8;
  local_58._8_8_ = 8;
  local_58._16_8_ =
       mserialize::serialized_size<std::multiset<int,std::less<int>,std::allocator<int>>>
                 ((multiset<int,_std::less<int>,_std::allocator<int>_> *)0x118c5a);
  this_00 = (QueueWriter *)(local_58 + 0x18);
  pQVar3 = (Queue *)mserialize::
                    serialized_size<std::multimap<int,char,std::less<int>,std::allocator<std::pair<int_const,char>>>>
                              ((multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>
                                *)0x118c88);
  this_00->_queue = pQVar3;
  local_70 = (_Base_ptr)local_38;
  local_60 = (_Base_ptr)local_58;
  for (local_68 = local_60; local_68 != local_70; local_68 = (_Base_ptr)&local_68->_M_parent) {
    local_78 = *(_Base_ptr *)local_68;
    local_38[0] = local_38[0] + (long)&local_78->_M_color;
  }
  local_80 = local_38[0] + 4;
  uVar1 = detail::QueueWriter::beginWrite
                    (this_00,CONCAT17(in_stack_ffffffffffffff3f,
                                      CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38))
                    );
  if (!(bool)uVar1) {
    replaceChannel(in_stack_00000018,in_stack_00000010);
    bVar2 = detail::QueueWriter::beginWrite
                      (this_00,CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff3e,
                                                       in_stack_ffffffffffffff38)));
    if (!bVar2) {
      return false;
    }
  }
  mserialize::serialize<unsigned_int,binlog::detail::QueueWriter>
            ((uint *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  in = (multiset<int,_std::less<int>,_std::allocator<int>_> *)local_88;
  mserialize::
  serialize<std::multiset<int,std::less<int>,std::allocator<int>>,binlog::detail::QueueWriter>
            (in,in_stack_ffffffffffffff18);
  *(undefined4 *)&(in->_M_t)._M_impl = 0;
  ostream = (QueueWriter *)(local_88 + 4);
  mserialize::
  serialize<std::multimap<int,char,std::less<int>,std::allocator<std::pair<int_const,char>>>,binlog::detail::QueueWriter>
            ((multimap<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_> *)in
             ,ostream);
  *(undefined4 *)&ostream->_queue = 0;
  detail::QueueWriter::endWrite(this_00);
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}